

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void test<unsigned_long>(bool shouldBeValid,string *value)

{
  long lVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  char cVar8;
  undefined7 in_register_00000039;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  bool valid;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  bool local_5a;
  bool local_59;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (value->_M_string_length == 0) {
LAB_001217b5:
    local_5a = false;
    uVar11 = 0;
  }
  else {
    pcVar6 = (value->_M_dataplus)._M_p;
    if (*pcVar6 == '-') goto LAB_001217b5;
    pcVar5 = pcVar6 + value->_M_string_length;
    if (*pcVar6 == '+') {
      pcVar6 = pcVar6 + 1;
    }
    if (pcVar6 == pcVar5) goto LAB_001217b5;
    uVar7 = 0;
    uVar9 = CONCAT71(in_register_00000039,shouldBeValid);
    do {
      uVar11 = uVar7;
      if ((byte)(*pcVar6 - 0x3aU) < 0xf6) {
LAB_00121831:
        local_5a = false;
        bVar4 = false;
        uVar7 = uVar11;
      }
      else {
        bVar10 = *pcVar6 - 0x30;
        if ((0x1999999999999999 < uVar11) || (5 < bVar10 && uVar11 == 0x1999999999999999))
        goto LAB_00121831;
        lVar1 = uVar11 * 10;
        bVar4 = true;
        uVar11 = uVar9;
        uVar7 = (ulong)bVar10 + lVar1;
      }
      if (!bVar4) goto LAB_00121848;
      pcVar6 = pcVar6 + 1;
      uVar9 = uVar11;
    } while (pcVar6 < pcVar5);
    local_5a = true;
    uVar11 = uVar7;
  }
LAB_00121848:
  local_59 = shouldBeValid;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_40,"shouldBeValid","valid",&local_59,&local_5a);
  if ((char)local_40._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_50);
    if ((undefined8 *)CONCAT44(local_40._M_string_length._4_4_,(uint)local_40._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT44(local_40._M_string_length._4_4_,(uint)local_40._M_string_length);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xc,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if (local_50.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_50.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_50.ptr_ + 8))();
      }
      local_50.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_40._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_40._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_59 != true) {
    return;
  }
  cVar8 = '\x01';
  if (9 < uVar11) {
    uVar7 = uVar11;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (uVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00121992;
      }
      if (uVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00121992;
      }
      if (uVar7 < 10000) goto LAB_00121992;
      bVar4 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar4);
    cVar8 = cVar8 + '\x01';
  }
LAB_00121992:
  paVar2 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_40._M_dataplus._M_p,(uint)local_40._M_string_length,uVar11);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_50,"value","std::to_string(result)",value,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_50.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xe,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (value->_M_string_length != 0) {
    pcVar6 = (value->_M_dataplus)._M_p;
    if (*pcVar6 != '-') {
      pcVar5 = pcVar6 + value->_M_string_length;
      if (*pcVar6 == '+') {
        pcVar6 = pcVar6 + 1;
      }
      if (pcVar6 != pcVar5) {
        uVar11 = 0;
        do {
          cVar8 = *pcVar6;
          pcVar6 = pcVar6 + 1;
          uVar11 = ((long)cVar8 + uVar11 * 10) - 0x30;
        } while (pcVar6 != pcVar5);
        goto LAB_00121a5a;
      }
    }
  }
  uVar11 = 0;
LAB_00121a5a:
  cVar8 = '\x01';
  if (9 < uVar11) {
    uVar7 = uVar11;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (uVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00121b42;
      }
      if (uVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00121b42;
      }
      if (uVar7 < 10000) goto LAB_00121b42;
      bVar4 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar4);
    cVar8 = cVar8 + '\x01';
  }
LAB_00121b42:
  local_40._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct((ulong)&local_40,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_40._M_dataplus._M_p,(uint)local_40._M_string_length,uVar11);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_50,"value","std::to_string(result2)",value,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (local_50.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x10,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_40._M_dataplus._M_p + 8))();
      }
      local_40._M_dataplus._M_p = (pointer)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

static void test(bool shouldBeValid, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_EQ(shouldBeValid, valid);
  if (shouldBeValid) {
    ASSERT_EQ(value, std::to_string(result));
    T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
    ASSERT_EQ(value, std::to_string(result2));
  }
}